

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

void crypto::xchacha20::run_rounds(word *keystream)

{
  uint uVar1;
  uint *in_RDI;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    *in_RDI = in_RDI[4] + *in_RDI;
    in_RDI[0xc] = in_RDI[0xc] ^ *in_RDI;
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xc],0x10);
    in_RDI[0xc] = uVar1;
    in_RDI[8] = in_RDI[0xc] + in_RDI[8];
    in_RDI[4] = in_RDI[4] ^ in_RDI[8];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[4],0xc);
    in_RDI[4] = uVar1;
    *in_RDI = in_RDI[4] + *in_RDI;
    in_RDI[0xc] = in_RDI[0xc] ^ *in_RDI;
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xc],8);
    in_RDI[0xc] = uVar1;
    in_RDI[8] = in_RDI[0xc] + in_RDI[8];
    in_RDI[4] = in_RDI[4] ^ in_RDI[8];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[4],7);
    in_RDI[4] = uVar1;
    in_RDI[1] = in_RDI[5] + in_RDI[1];
    in_RDI[0xd] = in_RDI[0xd] ^ in_RDI[1];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xd],0x10);
    in_RDI[0xd] = uVar1;
    in_RDI[9] = in_RDI[0xd] + in_RDI[9];
    in_RDI[5] = in_RDI[5] ^ in_RDI[9];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[5],0xc);
    in_RDI[5] = uVar1;
    in_RDI[1] = in_RDI[5] + in_RDI[1];
    in_RDI[0xd] = in_RDI[0xd] ^ in_RDI[1];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xd],8);
    in_RDI[0xd] = uVar1;
    in_RDI[9] = in_RDI[0xd] + in_RDI[9];
    in_RDI[5] = in_RDI[5] ^ in_RDI[9];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[5],7);
    in_RDI[5] = uVar1;
    in_RDI[2] = in_RDI[6] + in_RDI[2];
    in_RDI[0xe] = in_RDI[0xe] ^ in_RDI[2];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xe],0x10);
    in_RDI[0xe] = uVar1;
    in_RDI[10] = in_RDI[0xe] + in_RDI[10];
    in_RDI[6] = in_RDI[6] ^ in_RDI[10];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[6],0xc);
    in_RDI[6] = uVar1;
    in_RDI[2] = in_RDI[6] + in_RDI[2];
    in_RDI[0xe] = in_RDI[0xe] ^ in_RDI[2];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xe],8);
    in_RDI[0xe] = uVar1;
    in_RDI[10] = in_RDI[0xe] + in_RDI[10];
    in_RDI[6] = in_RDI[6] ^ in_RDI[10];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[6],7);
    in_RDI[6] = uVar1;
    in_RDI[3] = in_RDI[7] + in_RDI[3];
    in_RDI[0xf] = in_RDI[0xf] ^ in_RDI[3];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xf],0x10);
    in_RDI[0xf] = uVar1;
    in_RDI[0xb] = in_RDI[0xf] + in_RDI[0xb];
    in_RDI[7] = in_RDI[7] ^ in_RDI[0xb];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[7],0xc);
    in_RDI[7] = uVar1;
    in_RDI[3] = in_RDI[7] + in_RDI[3];
    in_RDI[0xf] = in_RDI[0xf] ^ in_RDI[3];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xf],8);
    in_RDI[0xf] = uVar1;
    in_RDI[0xb] = in_RDI[0xf] + in_RDI[0xb];
    in_RDI[7] = in_RDI[7] ^ in_RDI[0xb];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[7],7);
    in_RDI[7] = uVar1;
    *in_RDI = in_RDI[5] + *in_RDI;
    in_RDI[0xf] = in_RDI[0xf] ^ *in_RDI;
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xf],0x10);
    in_RDI[0xf] = uVar1;
    in_RDI[10] = in_RDI[0xf] + in_RDI[10];
    in_RDI[5] = in_RDI[5] ^ in_RDI[10];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[5],0xc);
    in_RDI[5] = uVar1;
    *in_RDI = in_RDI[5] + *in_RDI;
    in_RDI[0xf] = in_RDI[0xf] ^ *in_RDI;
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xf],8);
    in_RDI[0xf] = uVar1;
    in_RDI[10] = in_RDI[0xf] + in_RDI[10];
    in_RDI[5] = in_RDI[5] ^ in_RDI[10];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[5],7);
    in_RDI[5] = uVar1;
    in_RDI[1] = in_RDI[6] + in_RDI[1];
    in_RDI[0xc] = in_RDI[0xc] ^ in_RDI[1];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xc],0x10);
    in_RDI[0xc] = uVar1;
    in_RDI[0xb] = in_RDI[0xc] + in_RDI[0xb];
    in_RDI[6] = in_RDI[6] ^ in_RDI[0xb];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[6],0xc);
    in_RDI[6] = uVar1;
    in_RDI[1] = in_RDI[6] + in_RDI[1];
    in_RDI[0xc] = in_RDI[0xc] ^ in_RDI[1];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xc],8);
    in_RDI[0xc] = uVar1;
    in_RDI[0xb] = in_RDI[0xc] + in_RDI[0xb];
    in_RDI[6] = in_RDI[6] ^ in_RDI[0xb];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[6],7);
    in_RDI[6] = uVar1;
    in_RDI[2] = in_RDI[7] + in_RDI[2];
    in_RDI[0xd] = in_RDI[0xd] ^ in_RDI[2];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xd],0x10);
    in_RDI[0xd] = uVar1;
    in_RDI[8] = in_RDI[0xd] + in_RDI[8];
    in_RDI[7] = in_RDI[7] ^ in_RDI[8];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[7],0xc);
    in_RDI[7] = uVar1;
    in_RDI[2] = in_RDI[7] + in_RDI[2];
    in_RDI[0xd] = in_RDI[0xd] ^ in_RDI[2];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xd],8);
    in_RDI[0xd] = uVar1;
    in_RDI[8] = in_RDI[0xd] + in_RDI[8];
    in_RDI[7] = in_RDI[7] ^ in_RDI[8];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[7],7);
    in_RDI[7] = uVar1;
    in_RDI[3] = in_RDI[4] + in_RDI[3];
    in_RDI[0xe] = in_RDI[0xe] ^ in_RDI[3];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xe],0x10);
    in_RDI[0xe] = uVar1;
    in_RDI[9] = in_RDI[0xe] + in_RDI[9];
    in_RDI[4] = in_RDI[4] ^ in_RDI[9];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[4],0xc);
    in_RDI[4] = uVar1;
    in_RDI[3] = in_RDI[4] + in_RDI[3];
    in_RDI[0xe] = in_RDI[0xe] ^ in_RDI[3];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[0xe],8);
    in_RDI[0xe] = uVar1;
    in_RDI[9] = in_RDI[0xe] + in_RDI[9];
    in_RDI[4] = in_RDI[4] ^ in_RDI[9];
    uVar1 = util::rotl_fixed<unsigned_int>(in_RDI[4],7);
    in_RDI[4] = uVar1;
  }
  return;
}

Assistant:

void xchacha20::run_rounds(word keystream[16]) {
	
	#define CHACHA20_QR(a, b, c, d) \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 16); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 12); \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 8); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 7);
	
	for(size_t i = 0; i < 10; i++) {
		CHACHA20_QR(keystream[0], keystream[4], keystream[8], keystream[12]);  // column 0
		CHACHA20_QR(keystream[1], keystream[5], keystream[9], keystream[13]);  // column 1
		CHACHA20_QR(keystream[2], keystream[6], keystream[10], keystream[14]); // column 2
		CHACHA20_QR(keystream[3], keystream[7], keystream[11], keystream[15]); // column 3
		CHACHA20_QR(keystream[0], keystream[5], keystream[10], keystream[15]); // diagonal 1 (main diagonal)
		CHACHA20_QR(keystream[1], keystream[6], keystream[11], keystream[12]); // diagonal 2
		CHACHA20_QR(keystream[2], keystream[7], keystream[8], keystream[13]);  // diagonal 3
		CHACHA20_QR(keystream[3], keystream[4], keystream[9], keystream[14]);  // diagonal 4
	}
	
	#undef CHACHA20_QR
	
}